

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void helper_mac_move_m68k(CPUM68KState_conflict *env,uint32_t dest,uint32_t src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x100 << ((byte)dest & 0x1f);
  env->macc[dest] = env->macc[src];
  uVar1 = env->macsr;
  uVar3 = uVar2 | uVar1;
  if (((uVar1 >> ((byte)src & 0x1f)) >> 8 & 1) == 0) {
    uVar3 = ~uVar2 & uVar1;
  }
  env->macsr = uVar3;
  return;
}

Assistant:

void HELPER(mac_move)(CPUM68KState *env, uint32_t dest, uint32_t src)
{
    uint32_t mask;
    env->macc[dest] = env->macc[src];
    mask = MACSR_PAV0 << dest;
    if (env->macsr & (MACSR_PAV0 << src))
        env->macsr |= mask;
    else
        env->macsr &= ~mask;
}